

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::createTexture_ptex(SemanticParser *this,SP *in)

{
  long lVar1;
  size_type sVar2;
  int iVar3;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  SP SVar5;
  string fileName;
  undefined1 local_59;
  string local_58;
  string local_38;
  
  lVar1 = *in_RDX;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"filename","");
  syntactic::ParamSet::getParamString(&local_38,(ParamSet *)(lVar1 + 8),&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"warning: pbrt image texture, but no filename!?",0x2e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  local_58._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::PtexFileTexture,std::allocator<pbrt::PtexFileTexture>,std::__cxx11::string_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length,
             (PtexFileTexture **)&local_58,(allocator<pbrt::PtexFileTexture> *)&local_59,&local_38);
  std::__shared_ptr<pbrt::PtexFileTexture,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::PtexFileTexture,pbrt::PtexFileTexture>
            ((__shared_ptr<pbrt::PtexFileTexture,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (PtexFileTexture *)local_58._M_dataplus._M_p);
  sVar2 = local_58._M_string_length;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._M_string_length = 0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_58._M_dataplus._M_p;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2;
  _Var4._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    _Var4._M_pi = extraout_RDX_00;
  }
  SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_ptex(pbrt::syntactic::Texture::SP in)
  {
    const std::string fileName = in->getParamString("filename");
    if (fileName == "")
      std::cerr << "warning: pbrt image texture, but no filename!?" << std::endl;
    return std::make_shared<PtexFileTexture>(fileName);
  }